

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

void __thiscall
HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
::HashTable(HashTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
            *this)

{
  uint uVar1;
  undefined8 *puVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  this->capacity = 8;
  this->size = 0;
  this->PRIME = 7;
  puVar2 = (undefined8 *)operator_new__(0x5c8);
  *puVar2 = 8;
  lVar4 = 0;
  do {
    *(long *)((long)puVar2 + lVar4 + 8) = (long)puVar2 + lVar4 + 0x18;
    *(undefined8 *)((long)puVar2 + lVar4 + 0x10) = 0;
    *(undefined1 *)((long)puVar2 + lVar4 + 0x18) = 0;
    *(undefined4 *)((long)puVar2 + lVar4 + 0x28) = 2;
    *(long *)((long)puVar2 + lVar4 + 0x30) = (long)puVar2 + lVar4 + 0x40;
    *(undefined8 *)((long)puVar2 + lVar4 + 0x38) = 0;
    *(undefined1 *)((long)puVar2 + lVar4 + 0x40) = 0;
    *(long *)((long)puVar2 + lVar4 + 0x50) = (long)puVar2 + lVar4 + 0x60;
    *(undefined8 *)((long)puVar2 + lVar4 + 0x58) = 0;
    *(undefined1 *)((long)puVar2 + lVar4 + 0x60) = 0;
    *(long *)((long)puVar2 + lVar4 + 0x78) = (long)puVar2 + lVar4 + 0x88;
    *(undefined8 *)((long)puVar2 + lVar4 + 0x80) = 0;
    *(undefined1 *)((long)puVar2 + lVar4 + 0x88) = 0;
    *(long *)((long)puVar2 + lVar4 + 0x98) = (long)puVar2 + lVar4 + 0xa8;
    *(undefined8 *)((long)puVar2 + lVar4 + 0xa0) = 0;
    *(undefined1 *)((long)puVar2 + lVar4 + 0xa8) = 0;
    *(undefined4 *)((long)puVar2 + lVar4 + 0xb8) = 0xffffffff;
    lVar4 = lVar4 + 0xb8;
  } while (lVar4 != 0x5c0);
  this->table = (TableItems<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lablnet::FileMeta>
                 *)(puVar2 + 1);
  iVar5 = -5;
  uVar3 = 8;
  do {
    bVar8 = uVar3 == 2;
    if ((uVar3 & 1) != 0) {
      uVar1 = 3;
      do {
        uVar6 = uVar1;
        uVar7 = uVar3;
        if (iVar5 + uVar6 == 3) break;
        uVar1 = uVar6 + 1;
        uVar7 = uVar6;
      } while (uVar3 % uVar6 != 0);
      bVar8 = uVar3 <= uVar7;
    }
    if (bVar8) goto LAB_00113b71;
    iVar5 = iVar5 + 1;
    bVar8 = 2 < uVar3;
    uVar3 = uVar3 - 1;
  } while (bVar8);
  uVar3 = 0xffffffff;
LAB_00113b71:
  this->PRIME = uVar3;
  if (0 < this->capacity) {
    HashTable<std::__cxx11::string,lablnet::FileMeta>::HashTable();
  }
  return;
}

Assistant:

HashTable() {
        this->table = new TableItems<K, V>[capacity];
        this->PRIME = lablnet::findLeastPrime(this->capacity);
        for (int i = 0; i< this->capacity; i++) {
            this->table[i] = TableItems<K, V>();
        }
    }